

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_control.c
# Opt level: O0

int volume_control_segment_info(mixed_segment_info *info,mixed_segment *segment)

{
  mixed_segment_field_info *field;
  mixed_segment *segment_local;
  mixed_segment_info *info_local;
  
  __ignore('\0');
  info->name = "volume_control";
  info->description = "General segment for volume adjustment and panning.";
  info->flags = MIXED_IN;
  info->min_inputs = 2;
  info->max_inputs = 2;
  info->outputs = 2;
  set_info_field(info->fields,0,MIXED_BUFFER_POINTER,1,MIXED_SET|MIXED_MODIFIES_INPUT|MIXED_IN,
                 "The buffer for audio data attached to the location.");
  set_info_field(info->fields + 1,3,9,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "The volume scaling factor for the input.");
  set_info_field(info->fields + 2,5,9,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "The left/right stereo panning.");
  set_info_field(info->fields + 3,1,MIXED_BOOL,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "Bypass the segment\'s processing.");
  clear_info_field(info->fields + 4);
  return 1;
}

Assistant:

int volume_control_segment_info(struct mixed_segment_info *info, struct mixed_segment *segment){
  IGNORE(segment);
  info->name = "volume_control";
  info->description = "General segment for volume adjustment and panning.";
  info->flags = MIXED_INPLACE;
  info->min_inputs = 2;
  info->max_inputs = 2;
  info->outputs = 2;
  
  struct mixed_segment_field_info *field = info->fields;
  set_info_field(field++, MIXED_BUFFER,
                 MIXED_BUFFER_POINTER, 1, MIXED_IN | MIXED_OUT | MIXED_SET,
                 "The buffer for audio data attached to the location.");

  set_info_field(field++, MIXED_VOLUME,
                 MIXED_FLOAT, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "The volume scaling factor for the input.");

  set_info_field(field++, MIXED_VOLUME_CONTROL_PAN,
                 MIXED_FLOAT, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "The left/right stereo panning.");

  set_info_field(field++, MIXED_BYPASS,
                 MIXED_BOOL, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "Bypass the segment's processing.");
  
  clear_info_field(field++);
  return 1;
}